

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_group_t bsc_group_create_neighbourhood(bsc_pid_t *neighbours,bsc_size_t size)

{
  int iVar1;
  bsp_pid_t *pbVar2;
  bsp_pid_t *pbVar3;
  bsp_size_t *pbVar4;
  group_t *g;
  uint uVar5;
  bsp_pid_t bVar6;
  undefined4 extraout_var;
  void *addr;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bsc_size_t offset;
  int local_64;
  undefined4 local_4c;
  void *local_48;
  ulong local_40;
  group_t *local_38;
  
  uVar5 = bsp_nprocs();
  bVar6 = bsp_pid();
  addr = calloc((long)(int)uVar5,4);
  pvVar7 = calloc((long)(int)uVar5,4);
  local_38 = (group_t *)calloc(1,0x20);
  if ((pvVar7 == (void *)0x0 || addr == (void *)0x0) || local_38 == (group_t *)0x0) {
    bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
  }
  bsp_push_reg(addr,uVar5 * 4);
  bsp_sync();
  local_48 = pvVar7;
  if (0 < size) {
    uVar9 = 0;
    do {
      uVar8 = uVar9 + 1;
      local_4c = (int)uVar8;
      bsp_put(neighbours[uVar9],&local_4c,addr,bVar6 * 4,4);
      *(int *)((long)local_48 + (long)neighbours[uVar9] * 4) = (int)uVar8;
      uVar9 = uVar8;
    } while ((uint)size != uVar8);
  }
  local_40 = (ulong)(uint)size;
  bsp_sync();
  pvVar7 = local_48;
  if (*(int *)((long)local_48 + (long)bVar6 * 4) == 0) {
    bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");
  }
  g = local_38;
  if ((int)uVar5 < 1) {
    local_64 = 0;
  }
  else {
    uVar9 = 0;
    local_64 = 0;
    do {
      iVar1 = *(int *)((long)addr + uVar9 * 4);
      if (iVar1 == 0) {
LAB_001120e1:
        if (*(int *)((long)pvVar7 + uVar9 * 4) == 0) {
          if (iVar1 != 0) goto LAB_00112113;
        }
        else {
          uVar8 = uVar9 & 0xffffffff;
          uVar10 = CONCAT44(extraout_var,bVar6);
LAB_00112106:
          bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d is a neighbour, but that feeling is not mutual\n"
                    ,uVar10,uVar8);
        }
      }
      else {
        if (*(int *)((long)pvVar7 + uVar9 * 4) == 0) {
          uVar10 = uVar9 & 0xffffffff;
          uVar8 = CONCAT44(extraout_var,bVar6);
          goto LAB_00112106;
        }
        if (iVar1 == 0) goto LAB_001120e1;
LAB_00112113:
        local_64 = (local_64 + 1) - (uint)(*(int *)((long)pvVar7 + uVar9 * 4) == 0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  group_create(g,local_64);
  if (0 < (int)uVar5) {
    memset(g->lid,0xff,(ulong)uVar5 << 2);
  }
  if (0 < size) {
    pbVar2 = g->lid;
    pbVar3 = g->gid;
    pbVar4 = g->rof;
    uVar9 = 0;
    do {
      pbVar2[neighbours[uVar9]] = (bsp_pid_t)uVar9;
      pbVar4[uVar9] = *(int *)((long)addr + (long)neighbours[uVar9] * 4) + -1;
      pbVar3[uVar9] = neighbours[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_40 != uVar9);
  }
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  free(pvVar7);
  return g;
}

Assistant:

bsc_group_t bsc_group_create_neighbourhood( bsc_pid_t * neighbours, 
        bsc_size_t size )
{
    bsc_pid_t i, P = bsp_nprocs(), s = bsp_pid();
    bsc_pid_t n_members = 0;
    bsc_size_t * incoming = calloc( P, sizeof(incoming[0]));
    bsc_size_t * outgoing = calloc( P, sizeof(outgoing[0]));
    group_t * g = calloc( 1, sizeof(*g) );
    if (!incoming || !outgoing || !g)
        bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
    bsp_push_reg( incoming, P*sizeof(incoming[0]) );
    bsp_sync();

    /* fill the communication matrix with a 1 for each connection */
    for ( i = 0 ; i < size ; ++i ) {
        bsc_size_t offset = i+1;
        bsp_put( neighbours[i], &offset, incoming, s*sizeof(offset), sizeof(offset) );
        outgoing[ neighbours[i] ] = i+1 ;
    }
    bsp_sync();

    if ( !outgoing[s] )
        bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");

    /* take the intersection of incoming and outgoing */
    for ( i = 0; i < P; ++i ) {
        if (incoming[i] && !outgoing[i])  {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    i, s );
        }
        else if (!incoming[i] && outgoing[i]) {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    s, i );
        }
        else if (incoming[i] && outgoing[i])
            n_members += 1;
    }

    group_create( g, n_members );
    for ( i = 0; i < P; ++i )
        g->lid[i] = -1;

    for ( i = 0; i < size; ++i ) {
        g->lid[ neighbours[i] ] = i;
        g->rof[ i ] = incoming[ neighbours[i] ] - 1;
        g->gid[ i ] = neighbours[i];
    }

    bsp_pop_reg(incoming);
    bsp_sync();
    free(incoming);
    free(outgoing);

    return g;
}